

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimalControlProblem.cpp
# Opt level: O0

bool __thiscall
iDynTree::optimalcontrol::OptimalControlProblem::setControlUpperBound
          (OptimalControlProblem *this,VectorDynSize *maxControl)

{
  bool bVar1;
  shared_ptr<iDynTree::optimalcontrol::TimeInvariantObject<iDynTree::VectorDynSize>_> *__r;
  element_type *this_00;
  shared_ptr<iDynTree::optimalcontrol::TimeInvariantObject<iDynTree::VectorDynSize>_> *psVar2;
  shared_ptr<iDynTree::optimalcontrol::TimeVaryingObject<iDynTree::VectorDynSize>_> *in_RDI;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  
  bVar1 = std::__shared_ptr::operator_cast_to_bool
                    ((__shared_ptr *)
                     ((in_RDI->
                      super___shared_ptr<iDynTree::optimalcontrol::TimeVaryingObject<iDynTree::VectorDynSize>,_(__gnu_cxx::_Lock_policy)2>
                      )._M_ptr + 3));
  if (bVar1) {
    __r = (shared_ptr<iDynTree::optimalcontrol::TimeInvariantObject<iDynTree::VectorDynSize>_> *)
          iDynTree::VectorDynSize::size();
    this_00 = std::
              __shared_ptr_access<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x2fcd4e);
    psVar2 = (shared_ptr<iDynTree::optimalcontrol::TimeInvariantObject<iDynTree::VectorDynSize>_> *)
             DynamicalSystem::controlSpaceSize(this_00);
    if (__r == psVar2) {
      *(undefined1 *)
       ((long)&(in_RDI->
               super___shared_ptr<iDynTree::optimalcontrol::TimeVaryingObject<iDynTree::VectorDynSize>,_(__gnu_cxx::_Lock_policy)2>
               )._M_ptr[0x11]._vptr_TimeVaryingObject + 3) = 1;
      std::
      make_shared<iDynTree::optimalcontrol::TimeInvariantObject<iDynTree::VectorDynSize>,iDynTree::VectorDynSize_const&>
                ((VectorDynSize *)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8));
      std::shared_ptr<iDynTree::optimalcontrol::TimeVaryingObject<iDynTree::VectorDynSize>>::
      operator=(in_RDI,__r);
      std::shared_ptr<iDynTree::optimalcontrol::TimeInvariantObject<iDynTree::VectorDynSize>_>::
      ~shared_ptr((shared_ptr<iDynTree::optimalcontrol::TimeInvariantObject<iDynTree::VectorDynSize>_>
                   *)0x2fcdc4);
      bVar1 = true;
    }
    else {
      iDynTree::reportError
                ("OptimalControlProblem","setControlUpperBound",
                 "The dimension of maxControl does not coincide with the control dimension.");
      bVar1 = false;
    }
  }
  else {
    iDynTree::reportError
              ("OptimalControlProblem","setControlUpperBound",
               "First a dynamical system has to be set.");
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool OptimalControlProblem::setControlUpperBound(const VectorDynSize &maxControl)
        {
            if (!(m_pimpl->dynamicalSystem)){
                reportError("OptimalControlProblem", "setControlUpperBound", "First a dynamical system has to be set.");
                return false;
            }

            if (maxControl.size() != m_pimpl->dynamicalSystem->controlSpaceSize()) {
                reportError("OptimalControlProblem", "setControlUpperBound", "The dimension of maxControl does not coincide with the control dimension.");
                return false;
            }

            m_pimpl->controlUpperBounded = true;
            m_pimpl->controlUpperBound = std::make_shared<TimeInvariantVector>(maxControl);

            return true;
        }